

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

float64 * gauden_scale_densities_fwd
                    (float64 ***den,uint32 ***den_idx,uint32 *cb,uint32 n_cb,gauden_t *g)

{
  uint uVar1;
  float64 *pfVar2;
  double dVar3;
  float64 *max_den;
  uint32 k;
  uint32 j;
  uint32 c;
  uint32 i;
  gauden_t *g_local;
  uint32 n_cb_local;
  uint32 *cb_local;
  uint32 ***den_idx_local;
  float64 ***den_local;
  
  if (g->n_top <= g->n_density) {
    pfVar2 = (float64 *)
             __ckd_calloc__((ulong)g->n_feat,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x50b);
    for (max_den._4_4_ = 0; max_den._4_4_ < g->n_feat; max_den._4_4_ = max_den._4_4_ + 1) {
      pfVar2[max_den._4_4_] = -1.8e+307;
    }
    for (j = 0; j < n_cb; j = j + 1) {
      uVar1 = cb[j];
      for (max_den._4_4_ = 0; max_den._4_4_ < g->n_feat; max_den._4_4_ = max_den._4_4_ + 1) {
        for (max_den._0_4_ = 0; (uint)max_den < g->n_top; max_den._0_4_ = (uint)max_den + 1) {
          if ((double)pfVar2[max_den._4_4_] < (double)den[uVar1][max_den._4_4_][(uint)max_den]) {
            pfVar2[max_den._4_4_] = den[uVar1][max_den._4_4_][(uint)max_den];
          }
        }
      }
    }
    for (max_den._4_4_ = 0; max_den._4_4_ < g->n_feat; max_den._4_4_ = max_den._4_4_ + 1) {
      pfVar2[max_den._4_4_] = (float64)((double)pfVar2[max_den._4_4_] - 10.0);
    }
    for (j = 0; j < n_cb; j = j + 1) {
      uVar1 = cb[j];
      for (max_den._4_4_ = 0; max_den._4_4_ < g->n_feat; max_den._4_4_ = max_den._4_4_ + 1) {
        for (max_den._0_4_ = 0; (uint)max_den < g->n_top; max_den._0_4_ = (uint)max_den + 1) {
          dVar3 = exp((double)den[uVar1][max_den._4_4_][(uint)max_den] -
                      (double)pfVar2[max_den._4_4_]);
          den[uVar1][max_den._4_4_][(uint)max_den] = (float64)dVar3;
        }
      }
    }
    return pfVar2;
  }
  __assert_fail("g->n_top <= g->n_density",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x509,
                "float64 *gauden_scale_densities_fwd(float64 ***, uint32 ***, uint32 *, uint32, gauden_t *)"
               );
}

Assistant:

float64 *
gauden_scale_densities_fwd(float64 ***den,		/* density array for a mixture Gaussian */
			   uint32 ***den_idx,
			   uint32 *cb,		/* Codebook indices */
			   uint32 n_cb,		/* total # of codebooks to scale */
			   gauden_t *g)		/* Gaussian density structure */
{
    uint32 i, c, j, k;
    float64 *max_den;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    max_den = ckd_calloc(g->n_feat, sizeof(float64));

    /* Initialize max_den to some value in the domain */
    for (j = 0; j < g->n_feat; j++) {
	max_den[j] = MIN_IEEE_NORM_NEG_FLOAT64;
    }

    /* Find the max for each feature */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_top; k++) {
		if (max_den[j] < den[c][j][k]) {
		    max_den[j] = den[c][j][k];
		}
	    }
	}
    }

    for (j = 0; j < g->n_feat; j++) {
	max_den[j] -= MAX_LOG_DEN;
    }
    
    /* Subtract/Divide max density from others */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_top; k++) {
		den[c][j][k] = exp(den[c][j][k] - max_den[j]);
	    }
	}
    }

    return max_den;
}